

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_set_list_Test::ObjectTest_basic_set_list_Test(ObjectTest_basic_set_list_Test *this)

{
  ObjectTest_basic_set_list_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ObjectTest_basic_set_list_Test_0080fbc0;
  return;
}

Assistant:

TEST(ObjectTest, basic_set_list) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::list<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::list<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::list<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::list<short>);
	OBJECT_BASIC_SET_TEST(obj, std::list<int>);
	OBJECT_BASIC_SET_TEST(obj, std::list<long>);
	OBJECT_BASIC_SET_TEST(obj, std::list<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::list<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::list<float>);
	OBJECT_BASIC_SET_TEST(obj, std::list<double>);
	OBJECT_BASIC_SET_TEST(obj, std::list<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::list<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::list<object>);
}